

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O1

bool __thiscall ON_NurbsCurve::Trim(ON_NurbsCurve *this,ON_Interval *in)

{
  double dVar1;
  int order;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint hint;
  long lVar5;
  ulong uVar6;
  double *pdVar7;
  bool bVar8;
  int iVar9;
  double split_t;
  ON_Interval local_40;
  
  bVar2 = ON_Interval::IsIncreasing(in);
  bVar8 = false;
  if (bVar2) {
    iVar9 = 0;
    if (0 < this->m_dim) {
      iVar9 = (this->m_dim + 1) - (uint)(this->m_is_rat == 0);
    }
    order = this->m_order;
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
    bVar2 = ON_Interval::operator==(in,&local_40);
    bVar8 = true;
    if (!bVar2) {
      ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
      dVar1 = in->m_t[1];
      iVar3 = ON_NurbsSpanIndex(order,this->m_cv_count,this->m_knot,dVar1,-1,0);
      pdVar7 = this->m_knot;
      local_40.m_t[0] = dVar1;
      bVar2 = TweakSplitTrimParameter
                        (pdVar7[(long)(iVar3 + order) + -2],pdVar7[(long)(iVar3 + order) + -1],
                         local_40.m_t);
      if (bVar2) {
        iVar3 = ON_NurbsSpanIndex(order,this->m_cv_count,pdVar7,local_40.m_t[0],-1,iVar3);
      }
      pdVar7 = this->m_cv + this->m_cv_stride * iVar3;
      if (this->m_cv == (double *)0x0) {
        pdVar7 = (double *)0x0;
      }
      bVar2 = ON_EvaluateNurbsDeBoor
                        (iVar9,order,this->m_cv_stride,pdVar7,this->m_knot + iVar3,-1,0.0,dVar1);
      if (bVar2) {
        this->m_cv_count = iVar3 + order;
        iVar4 = ON_KnotCount(order,iVar3 + order);
        iVar3 = this->m_cv_count;
        if (iVar3 <= iVar4) {
          pdVar7 = this->m_knot;
          lVar5 = (long)iVar4 + 1;
          do {
            pdVar7[lVar5 + -2] = dVar1;
            lVar5 = lVar5 + -1;
          } while (iVar3 < lVar5);
        }
        dVar1 = in->m_t[0];
        hint = ON_NurbsSpanIndex(order,iVar3,this->m_knot,dVar1,1,0);
        pdVar7 = this->m_knot;
        local_40.m_t[0] = dVar1;
        bVar2 = TweakSplitTrimParameter
                          (pdVar7[(long)(int)(hint + order) + -2],
                           pdVar7[(long)(int)(hint + order) + -1],local_40.m_t);
        if (bVar2) {
          hint = ON_NurbsSpanIndex(order,this->m_cv_count,pdVar7,local_40.m_t[0],1,hint);
        }
        pdVar7 = this->m_cv + (int)(this->m_cv_stride * hint);
        if (this->m_cv == (double *)0x0) {
          pdVar7 = (double *)0x0;
        }
        bVar2 = ON_EvaluateNurbsDeBoor
                          (iVar9,order,this->m_cv_stride,pdVar7,this->m_knot + (int)hint,1,0.0,dVar1
                          );
        if (bVar2) {
          if (0 < (int)hint) {
            iVar9 = this->m_cv_count;
            iVar3 = this->m_cv_stride;
            if ((int)(iVar3 * hint) < iVar3 * iVar9) {
              pdVar7 = this->m_cv;
              uVar6 = (ulong)(iVar3 * (iVar9 - hint));
              do {
                *pdVar7 = pdVar7[(int)(iVar3 * hint)];
                pdVar7 = pdVar7 + 1;
                uVar6 = uVar6 - 1;
              } while (uVar6 != 0);
            }
            iVar3 = ON_KnotCount(order,iVar9);
            uVar6 = (ulong)(iVar3 - hint);
            if (iVar3 - hint != 0 && (int)hint <= iVar3) {
              pdVar7 = this->m_knot;
              do {
                *pdVar7 = pdVar7[hint];
                pdVar7 = pdVar7 + 1;
                uVar6 = uVar6 - 1;
              } while (uVar6 != 0);
            }
            this->m_cv_count = iVar9 - hint;
          }
          if (1 < order) {
            pdVar7 = this->m_knot;
            uVar6 = 0;
            do {
              pdVar7[uVar6] = dVar1;
              uVar6 = uVar6 + 1;
            } while (order - 1 != uVar6);
          }
          ClampEnd(this,2);
          ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
          return true;
        }
        iVar9 = 0xbec;
      }
      else {
        iVar9 = 0xbd7;
      }
      bVar8 = false;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbscurve.cpp"
                 ,iVar9,"","ON_NurbsCurve::Trim() - right end de Boor algorithm failed.");
    }
  }
  return bVar8;
}

Assistant:

bool ON_NurbsCurve::Trim( const ON_Interval& in )
{
  if ( !in.IsIncreasing() )
    return false;

  const int cv_dim = CVSize();
  const int order = Order();
  double t, split_t;
  int ki, side, i0, i1, i1_max, new_cv_count;

	//Greg Arden 28 April 2003.  Do not change any curve that is trimmed to its entire domain.
	//             This is especially important for periodic curves.
	if(in==Domain())
	  return true;


  DestroyCurveTree();

  // cut off right end (or extend if in.m_t[1] > Domain.Max()
  side = -1;
  t = in.m_t[1]; // trimming parameter
  ki = ON_NurbsSpanIndex( order, m_cv_count, m_knot, t, side, 0 );

  // if t is very close to a knot value, then trim at the knot
  split_t = t;
  if ( TweakSplitTrimParameter(m_knot[ki+order-2], m_knot[ki+order-1], split_t ) )
    ki = ON_NurbsSpanIndex( order, m_cv_count, m_knot, split_t, side, ki );

  if ( !ON_EvaluateNurbsDeBoor( cv_dim, order, m_cv_stride, CV(ki),
                                m_knot + ki, side, 0.0, t ) ) 
  {
    ON_ERROR("ON_NurbsCurve::Trim() - right end de Boor algorithm failed.");
    return false;
  }
  // clamp right end knots
  m_cv_count = ki + order;
  for ( i0 = ON_KnotCount( order, m_cv_count)-1; i0 >= m_cv_count-1; i0--)
    m_knot[i0] = t;

  // cut off left end (or extend if in.m_t[0] < Domain.Max()
  side = 1;
  t = in.m_t[0]; // trimming parameter
  ki = ON_NurbsSpanIndex( order, m_cv_count, m_knot, t, side, 0 );

  // if t is very close to a knot value, then trim at the knot
  split_t = t;
  if (TweakSplitTrimParameter(m_knot[ki + order - 2], m_knot[ki + order - 1], split_t))
    ki = ON_NurbsSpanIndex( order, m_cv_count, m_knot, split_t, side, ki );

  if ( !ON_EvaluateNurbsDeBoor( cv_dim, order, m_cv_stride, CV(ki),
                                m_knot + ki, side, 0.0, t ) ) 
  {
    ON_ERROR("ON_NurbsCurve::Trim() - right end de Boor algorithm failed.");
    return false;
  }

  // remove surplus cvs and knots
  new_cv_count = m_cv_count - ki;
  if ( new_cv_count < m_cv_count ) {
    // move cvs and knots over
    i1_max = m_cv_stride*m_cv_count;
    for ( i0 = 0, i1 = ki*m_cv_stride; i1 < i1_max; i0++, i1++ )
      m_cv[i0] = m_cv[i1];
    i1_max = ON_KnotCount( order, m_cv_count );
    for ( i0 = 0, i1 = ki; i1 < i1_max; i0++, i1++ )
      m_knot[i0] = m_knot[i1];
    m_cv_count = new_cv_count;
  }

  // clamp left end knots
  for (i0 = 0; i0 <= order-2; i0++)
    m_knot[i0] = t;

  ClampEnd(2); // 26 June 2003 Dale Lear

	DestroyCurveTree();
  return true;
}